

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O0

void __thiscall PF_FileHandle::PF_FileHandle(PF_FileHandle *this,PF_FileHandle *fileHandle)

{
  PF_FileHandle *fileHandle_local;
  PF_FileHandle *this_local;
  
  this->pBufferMgr = fileHandle->pBufferMgr;
  this->hdr = fileHandle->hdr;
  this->bFileOpen = fileHandle->bFileOpen;
  this->bHdrChanged = fileHandle->bHdrChanged;
  this->unixfd = fileHandle->unixfd;
  return;
}

Assistant:

PF_FileHandle::PF_FileHandle(const PF_FileHandle &fileHandle)
{
   // Just copy the data members since there is no memory allocation involved
   this->pBufferMgr  = fileHandle.pBufferMgr;
   this->hdr         = fileHandle.hdr;
   this->bFileOpen   = fileHandle.bFileOpen;
   this->bHdrChanged = fileHandle.bHdrChanged;
   this->unixfd      = fileHandle.unixfd;
}